

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O0

bool tcu::isTrilinearAnyCompareValid
               (CompareMode compareMode,TexComparePrecision *prec,Vec4 *depths0,Vec4 *depths1,
               float cmpReference,float result,bool isFixedPointDepth)

{
  bool bVar1;
  CmpResultSet CVar2;
  CmpResultSet CVar3;
  CmpResultSet CVar4;
  CmpResultSet CVar5;
  CmpResultSet CVar6;
  CmpResultSet CVar7;
  CmpResultSet CVar8;
  CmpResultSet CVar9;
  float *pfVar10;
  float fVar11;
  float local_84;
  float local_7c;
  byte local_75;
  byte local_51;
  float maxBound;
  float minBound;
  float resErr;
  bool canBeFalse;
  bool canBeTrue;
  CmpResultSet cmp13;
  CmpResultSet cmp12;
  CmpResultSet cmp11;
  CmpResultSet cmp10;
  CmpResultSet cmp03;
  CmpResultSet cmp02;
  CmpResultSet cmp01;
  CmpResultSet cmp00;
  bool isFixedPointDepth_local;
  float result_local;
  float cmpReference_local;
  Vec4 *depths1_local;
  Vec4 *depths0_local;
  TexComparePrecision *prec_local;
  CompareMode compareMode_local;
  
  pfVar10 = Vector<float,_4>::operator[](depths0,0);
  CVar2 = execCompare(compareMode,*pfVar10,cmpReference,prec->referenceBits,isFixedPointDepth);
  pfVar10 = Vector<float,_4>::operator[](depths0,1);
  CVar3 = execCompare(compareMode,*pfVar10,cmpReference,prec->referenceBits,isFixedPointDepth);
  pfVar10 = Vector<float,_4>::operator[](depths0,2);
  CVar4 = execCompare(compareMode,*pfVar10,cmpReference,prec->referenceBits,isFixedPointDepth);
  pfVar10 = Vector<float,_4>::operator[](depths0,3);
  CVar5 = execCompare(compareMode,*pfVar10,cmpReference,prec->referenceBits,isFixedPointDepth);
  pfVar10 = Vector<float,_4>::operator[](depths1,0);
  CVar6 = execCompare(compareMode,*pfVar10,cmpReference,prec->referenceBits,isFixedPointDepth);
  pfVar10 = Vector<float,_4>::operator[](depths1,1);
  CVar7 = execCompare(compareMode,*pfVar10,cmpReference,prec->referenceBits,isFixedPointDepth);
  pfVar10 = Vector<float,_4>::operator[](depths1,2);
  CVar8 = execCompare(compareMode,*pfVar10,cmpReference,prec->referenceBits,isFixedPointDepth);
  pfVar10 = Vector<float,_4>::operator[](depths1,3);
  CVar9 = execCompare(compareMode,*pfVar10,cmpReference,prec->referenceBits,isFixedPointDepth);
  local_51 = 1;
  if ((((((ushort)CVar2 & 1) == 0) && (local_51 = 1, ((ushort)CVar3 & 1) == 0)) &&
      (local_51 = 1, ((ushort)CVar4 & 1) == 0)) &&
     (((local_51 = 1, ((ushort)CVar5 & 1) == 0 && (local_51 = 1, ((ushort)CVar6 & 1) == 0)) &&
      ((local_51 = 1, ((ushort)CVar7 & 1) == 0 && (local_51 = 1, ((ushort)CVar8 & 1) == 0)))))) {
    minBound._3_1_ = CVar9.isTrue;
    local_51 = minBound._3_1_;
  }
  local_75 = 1;
  if ((((((ushort)CVar2 & 0x100) == 0) && (local_75 = 1, ((ushort)CVar3 & 0x100) == 0)) &&
      ((local_75 = 1, ((ushort)CVar4 & 0x100) == 0 &&
       (((local_75 = 1, ((ushort)CVar5 & 0x100) == 0 && (local_75 = 1, ((ushort)CVar6 & 0x100) == 0)
         ) && (local_75 = 1, ((ushort)CVar7 & 0x100) == 0)))))) &&
     (local_75 = 1, ((ushort)CVar8 & 0x100) == 0)) {
    resErr._0_1_ = CVar9.isFalse;
    local_75 = resErr._0_1_;
  }
  fVar11 = TexVerifierUtil::computeFixedPointError(prec->resultBits);
  local_7c = 0.0;
  if ((local_75 & 1) == 0) {
    local_7c = 1.0;
  }
  local_84 = 1.0;
  if ((local_51 & 1) == 0) {
    local_84 = 0.0;
  }
  bVar1 = de::inRange<float>(result,local_7c - fVar11,local_84 + fVar11);
  return bVar1;
}

Assistant:

static bool isTrilinearAnyCompareValid (const Sampler::CompareMode	compareMode,
										const TexComparePrecision&	prec,
										const Vec4&					depths0,
										const Vec4&					depths1,
										const float					cmpReference,
										const float					result,
										const bool					isFixedPointDepth)
{
	DE_ASSERT(prec.pcfBits == 0);

	const CmpResultSet	cmp00		= execCompare(compareMode, depths0[0], cmpReference, prec.referenceBits, isFixedPointDepth);
	const CmpResultSet	cmp01		= execCompare(compareMode, depths0[1], cmpReference, prec.referenceBits, isFixedPointDepth);
	const CmpResultSet	cmp02		= execCompare(compareMode, depths0[2], cmpReference, prec.referenceBits, isFixedPointDepth);
	const CmpResultSet	cmp03		= execCompare(compareMode, depths0[3], cmpReference, prec.referenceBits, isFixedPointDepth);

	const CmpResultSet	cmp10		= execCompare(compareMode, depths1[0], cmpReference, prec.referenceBits, isFixedPointDepth);
	const CmpResultSet	cmp11		= execCompare(compareMode, depths1[1], cmpReference, prec.referenceBits, isFixedPointDepth);
	const CmpResultSet	cmp12		= execCompare(compareMode, depths1[2], cmpReference, prec.referenceBits, isFixedPointDepth);
	const CmpResultSet	cmp13		= execCompare(compareMode, depths1[3], cmpReference, prec.referenceBits, isFixedPointDepth);

	const bool			canBeTrue	= cmp00.isTrue ||
									  cmp01.isTrue ||
									  cmp02.isTrue ||
									  cmp03.isTrue ||
									  cmp10.isTrue ||
									  cmp11.isTrue ||
									  cmp12.isTrue ||
									  cmp13.isTrue;
	const bool			canBeFalse	= cmp00.isFalse ||
									  cmp01.isFalse ||
									  cmp02.isFalse ||
									  cmp03.isFalse ||
									  cmp10.isFalse ||
									  cmp11.isFalse ||
									  cmp12.isFalse ||
									  cmp13.isFalse;

	const float			resErr		= computeFixedPointError(prec.resultBits);

	const float			minBound	= canBeFalse ? 0.0f : 1.0f;
	const float			maxBound	= canBeTrue ? 1.0f : 0.0f;

	return de::inRange(result, minBound-resErr, maxBound+resErr);
}